

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::EquivalentTypeCache::ClearUnusedTypes(EquivalentTypeCache *this,Recycler *recycler)

{
  PropertyGuard *pPVar1;
  Type *address;
  code *pcVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ushort uVar7;
  undefined4 *puVar8;
  JitPolyEquivalentTypeGuard *pJVar9;
  void *address_00;
  uint8 i;
  uint8 uVar10;
  long lVar11;
  long lVar12;
  
  if (this->guard == (PropertyGuard *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x229e,"(this->guard)","this->guard");
    if (!bVar4) goto LAB_0077e985;
    *puVar8 = 0;
  }
  pPVar1 = this->guard;
  if (((ulong)pPVar1->value & 0xfffffffffffffffd) == 0) {
LAB_0077e7ad:
    bVar4 = false;
  }
  else if (pPVar1->isPoly == true) {
    pJVar9 = PropertyGuard::AsPolyTypeCheckGuard(pPVar1);
    uVar10 = '\0';
    bVar6 = false;
    do {
      address_00 = (void *)JitPolyEquivalentTypeGuard::GetPolyValue(pJVar9,uVar10);
      bVar4 = bVar6;
      if ((long)address_00 - 3U < 0xfffffffffffffffe) {
        bVar5 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address_00);
        bVar4 = true;
        if (!bVar5) {
          JitPolyEquivalentTypeGuard::InvalidateDuringSweep(pJVar9,uVar10);
          bVar4 = bVar6;
        }
      }
      uVar10 = uVar10 + '\x01';
      bVar6 = bVar4;
    } while (uVar10 != '\b');
  }
  else {
    bVar6 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,(void *)pPVar1->value);
    bVar4 = true;
    if (!bVar6) {
      pPVar1 = this->guard;
      pPVar1->wasReincarnated = true;
      pPVar1->value = 2;
      if (pPVar1->isPoly == true) {
        pJVar9 = PropertyGuard::AsPolyTypeCheckGuard(pPVar1);
        uVar10 = '\0';
        do {
          JitPolyEquivalentTypeGuard::InvalidateDuringSweep(pJVar9,uVar10);
          uVar10 = uVar10 + '\x01';
        } while (uVar10 != '\b');
      }
      goto LAB_0077e7ad;
    }
  }
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar12 = 0;
  bVar6 = false;
  uVar3 = 0;
  do {
    address = this->types[lVar12];
    lVar11 = lVar12;
    uVar7 = uVar3;
    if (address == (Type *)0x0) {
      do {
        if (this->types[lVar11] != (Type *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x22e1,"(this->types[__i] == nullptr)",
                                      "this->types[__i] == nullptr");
          if (!bVar5) goto LAB_0077e985;
          *puVar8 = 0;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
    }
    else {
      this->types[lVar12] = (Type *)0x0;
      bVar5 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address);
      if (bVar5) {
        uVar7 = uVar3 + 1;
        this->types[uVar3] = address;
        if (this->guard->isPoly == false) {
          if ((Type *)this->guard->value == address) {
            bVar6 = true;
          }
        }
        else {
          bVar6 = true;
        }
      }
    }
  } while ((address != (Type *)0x0) && (lVar12 = lVar12 + 1, uVar3 = uVar7, lVar12 != 8));
  bVar5 = true;
  if (uVar7 == 0) {
    pPVar1 = this->guard;
    bVar5 = bVar4;
    if (pPVar1->isPoly == true) {
      if (!bVar4) {
        pPVar1->value = 0;
        pJVar9 = PropertyGuard::AsPolyTypeCheckGuard(pPVar1);
        uVar10 = '\0';
        do {
          JitPolyEquivalentTypeGuard::Invalidate(pJVar9,uVar10);
          uVar10 = uVar10 + '\x01';
        } while (uVar10 != '\b');
      }
    }
    else if (pPVar1->value == 2) {
      pPVar1->value = 0;
    }
  }
  if ((((this->guard->value & 0xfffffffffffffffdU) != 0) && (uVar7 != 0)) && (!bVar6)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x22fb,
                                "(!this->guard->IsValid() || isGuardValuePresent || nonNullIndex == 0)"
                                ,
                                "After ClearUnusedTypes, valid guard value should be one of the cached equivalent types."
                               );
    if (!bVar4) {
LAB_0077e985:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  return bVar5;
}

Assistant:

bool EquivalentTypeCache::ClearUnusedTypes(Recycler *recycler)
    {
        bool isAnyTypeLive = false;

        Assert(this->guard);
        if (this->guard->IsValid())
        {
            if (this->guard->IsPoly())
            {
                JitPolyEquivalentTypeGuard * polyGuard = this->guard->AsPolyTypeCheckGuard();
                for (uint8 i = 0; i < polyGuard->GetSize(); i++)
                {
                    intptr_t value = polyGuard->GetPolyValue(i);
                    if (value != PropertyGuard::GuardValue::Uninitialized && value != PropertyGuard::GuardValue::Invalidated_DuringSweep)
                    {
                        Type *type = reinterpret_cast<Type*>(value);
                        if (!recycler->IsObjectMarked(type))
                        {
                            polyGuard->InvalidateDuringSweep(i);
                        }
                        else
                        {
                            isAnyTypeLive = true;
                        }
                    }
                }
            }
            else
            {
                Type *type = reinterpret_cast<Type*>(this->guard->GetValue());
                if (!recycler->IsObjectMarked(type))
                {
                    this->guard->InvalidateDuringSweep();
                }
                else
                {
                    isAnyTypeLive = true;
                }
            }
        }
        uint16 nonNullIndex = 0;
#if DBG
        bool isGuardValuePresent = false;
#endif
        for (int i = 0; i < EQUIVALENT_TYPE_CACHE_SIZE; i++)
        {
            Type *type = this->types[i];
            if (type != nullptr)
            {
                this->types[i] = nullptr;
                if (recycler->IsObjectMarked(type))
                {
                    // compact the types array by moving non-null types
                    // to the beginning.
                    this->types[nonNullIndex++] = type;
#if DBG
                    if (guard->IsPoly())
                    {
                        isGuardValuePresent = true;
                    }
                    else if (this->guard->GetValue() == reinterpret_cast<intptr_t>(type))
                    {
                        isGuardValuePresent = true;
                    }
#endif
                }
            }
            else
            {
#ifdef DEBUG
                for (int __i = i; __i < EQUIVALENT_TYPE_CACHE_SIZE; __i++)
                { Assert(this->types[__i] == nullptr); }
#endif
                break; // array must be shrinked already
            }
        }

        if (nonNullIndex > 0)
        {
            isAnyTypeLive = true;
        }
        else if (guard->IsPoly())
        {
            if (!isAnyTypeLive)
            {
                guard->Invalidate();
            }
        }
        else if (guard->IsInvalidatedDuringSweep())
        {
            // just mark this as actual invalidated since there are no types
            // present
            guard->Invalidate();
        }

        // verify if guard value is valid, it is present in one of the types
        AssertMsg(!this->guard->IsValid() || isGuardValuePresent || nonNullIndex == 0,
            "After ClearUnusedTypes, valid guard value should be one of the cached equivalent types.");
        return isAnyTypeLive;
    }